

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infozip.cpp
# Opt level: O0

int64_t iz_deflate(int level,char *tgt,char *src,ulg tgtsize,ulg srcsize)

{
  uzoff_t uVar1;
  int iStack_4b23c;
  ulg uStack_4b238;
  BufData buf;
  IZDeflate zid;
  int method;
  unsigned_long out_total;
  ush flags;
  ulg uStack_38;
  ush att;
  ulg srcsize_local;
  ulg tgtsize_local;
  char *src_local;
  char *tgt_local;
  long lStack_10;
  int level_local;
  
  out_total._6_2_ = 0xffff;
  out_total._4_2_ = 0;
  zid.read_handle._4_4_ = 8;
  uStack_38 = srcsize;
  srcsize_local = tgtsize;
  tgtsize_local = (ulg)src;
  src_local = tgt;
  tgt_local._4_4_ = level;
  IZDeflate::IZDeflate((IZDeflate *)&buf.fail);
  uStack_4b238 = tgtsize_local;
  buf.in_buf._0_4_ = (undefined4)uStack_38;
  buf.in_buf._4_4_ = 0;
  buf._8_8_ = &buf.fail;
  buf.zid._0_1_ = 0;
  zid._307576_8_ = mem_read;
  zid._307640_8_ = &uStack_4b238;
  zid.head[0x7ffc] = 0;
  zid.head[0x7ffd] = 0;
  zid.head[0x7ffe] = 0;
  zid.head[0x7fff] = 0;
  zid.mesg._0_4_ = tgt_local._4_4_;
  memset(&zid.out_offset,0,0x10000);
  IZDeflate::bi_init((IZDeflate *)&buf.fail,src_local,(uint)srcsize_local,0);
  IZDeflate::ct_init((IZDeflate *)&buf.fail,(ush *)((long)&out_total + 6),
                     (int *)((long)&zid.read_handle + 4));
  if ((int)zid.mesg == 0) {
    iStack_4b23c = 1;
  }
  else {
    iStack_4b23c = (int)zid.mesg;
  }
  IZDeflate::lm_init((IZDeflate *)&buf.fail,iStack_4b23c,(ush *)((long)&out_total + 4));
  uVar1 = IZDeflate::deflate((IZDeflate *)&buf.fail);
  if (((byte)buf.zid & 1) == 0) {
    if (zid.read_handle._4_4_ == 0) {
      lStack_10 = -2;
    }
    else {
      lStack_10 = ((uVar1 & 0xffffffff) - 1) * 8 + (long)(int)zid.bi_buf;
    }
  }
  else {
    lStack_10 = -1;
  }
  return lStack_10;
}

Assistant:

int64_t iz_deflate(int level, char* tgt, char* src, ulg tgtsize, ulg srcsize)
{
    ush att = (ush)UNKNOWN;
    ush flags = 0;
    unsigned long out_total = 0;
    int method = DEFLATE;

    IZDeflate zid;
    BufData buf;
    buf.in_buf = src;
    buf.in_size = (unsigned)srcsize;
    buf.in_offset = 0;
    buf.zid = &zid;
    buf.fail = false;

    zid.read_buf = mem_read;
    zid.read_handle = &buf;
    zid.window_size = 0L;
    zid.level = level;
    memset(zid.window, 0, sizeof(zid.window));

    zid.bi_init(tgt, (unsigned)(tgtsize), FALSE);
    zid.ct_init(&att, &method);
    zid.lm_init((zid.level != 0 ? zid.level : 1), &flags);
    out_total = (unsigned)zid.deflate();

    if (buf.fail)
        return -1;

    if (method == STORE)
        return -2;

    // printf("Last bits: %d\n", zid.last_bits);
    return ((out_total - 1) << 3) + zid.last_bits;
}